

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRDisplayNode::createChildren
          (VRDisplayNode *this,VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  int iVar1;
  undefined4 extraout_var;
  VRDisplayNode *pVVar2;
  _List_node_base *p_Var3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  VRDataIndex *local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string validatedNameSpace;
  
  local_d0 = config;
  VRDataIndex::validateNameSpace(&validatedNameSpace,config,nameSpace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"displaynodeType",&local_d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"*",&local_d2);
  std::__cxx11::string::string((string *)&local_c8,(string *)&validatedNameSpace);
  VRDataIndex::selectByAttribute((VRContainer *)&names,local_d0,&local_88,&local_a8,&local_c8,true);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  p_Var3 = (_List_node_base *)&names;
  while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&names) {
    iVar1 = VRDataIndex::isChild(nameSpace,(string *)(p_Var3 + 1));
    if (iVar1 == 1) {
      iVar1 = (*vrMain->_vptr_VRMainInterface[7])(vrMain);
      pVVar2 = VRFactory::create<MinVR::VRDisplayNode>
                         ((VRFactory *)CONCAT44(extraout_var,iVar1),vrMain,local_d0,
                          (string *)(p_Var3 + 1));
      if (pVVar2 != (VRDisplayNode *)0x0) {
        (*this->_vptr_VRDisplayNode[8])(this,pVVar2);
      }
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&names.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::string::~string((string *)&validatedNameSpace);
  return;
}

Assistant:

void VRDisplayNode::createChildren(VRMainInterface *vrMain,
                                   VRDataIndex *config,
                                   const std::string &nameSpace) {

  std::string validatedNameSpace = config->validateNameSpace(nameSpace);

  std::list<std::string> names =
    config->selectByAttribute("displaynodeType", "*", validatedNameSpace, true);

  for (std::list<std::string>::const_iterator it = names.begin();
       it != names.end(); ++it) {

    // We only want to do this for direct children. The grandchildren
    // and their progeny will be addressed in turn.
    if (VRDataIndex::isChild(nameSpace, *it) == 1) {

      VRDisplayNode *child =
        vrMain->getFactory()->create<VRDisplayNode>(vrMain, config, *it);
      if (child != NULL) {
        addChild(child);
      }
    }
  }
}